

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckFlicker(TidyDocImpl *doc,Node *node)

{
  Dict *pDVar1;
  Bool BVar2;
  int iVar3;
  AttVal *av;
  uint maxExt;
  uint code;
  bool bVar4;
  tmbchar ext [20];
  tmbchar atStack_38 [24];
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    pDVar1 = node->tag;
    if (pDVar1 == (Dict *)0x0) {
      code = 0;
    }
    else {
      bVar4 = pDVar1->id != TidyTag_SCRIPT;
      code = 0x2dd;
      if (bVar4) {
        code = 0;
      }
      if (bVar4 && pDVar1 != (Dict *)0x0) {
        bVar4 = pDVar1->id == TidyTag_OBJECT;
        code = 0;
        if (bVar4) {
          code = 0x2de;
        }
        if (!bVar4 && pDVar1 != (Dict *)0x0) {
          bVar4 = pDVar1->id != TidyTag_EMBED;
          code = 0x2df;
          if (bVar4) {
            code = 0;
          }
          if (bVar4 && pDVar1 != (Dict *)0x0) {
            bVar4 = pDVar1->id == TidyTag_APPLET;
            code = 0;
            if (bVar4) {
              code = 0x2e0;
            }
            if (!bVar4 && pDVar1 != (Dict *)0x0) {
              code = 0;
              if (pDVar1->id == TidyTag_IMG) {
                av = prvTidyAttrGetById(node,TidyAttr_SRC);
                BVar2 = hasValue(av);
                code = 0;
                if (BVar2 != no) {
                  GetFileExtension(av->value,atStack_38,maxExt);
                  iVar3 = prvTidytmbstrcasecmp(atStack_38,".gif");
                  code = 0x2e1;
                  if (iVar3 != 0) {
                    code = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (code != 0) {
      prvTidyReportAccessError(doc,node,code);
    }
  }
  return;
}

Assistant:

static void CheckFlicker( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = REMOVE_FLICKER_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = REMOVE_FLICKER_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = REMOVE_FLICKER_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = REMOVE_FLICKER_APPLET;

        /* Checks for animated gif within the <img> tag. */
        else if ( nodeIsIMG(node) )
        {
            AttVal* av = attrGetSRC( node );
            if ( hasValue(av) )
            {
                tmbchar ext[20];
                GetFileExtension( av->value, ext, sizeof(ext) );
                if ( TY_(tmbstrcasecmp)(ext, ".gif") == 0 )
                    msgcode = REMOVE_FLICKER_ANIMATED_GIF;
            }
        }            

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}